

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_package.cpp
# Opt level: O3

bool __thiscall
ParsePackage::PackageFuncList
          (ParsePackage *this,char *buf,int *len,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *func_map)

{
  bool bVar1;
  size_t sVar2;
  _Base_ptr p_Var3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  _Rb_tree_header *p_Var7;
  int num;
  char *local_58;
  int local_4c;
  char *local_48;
  int *local_40;
  _Rb_tree_node_base *local_38;
  
  if (buf == (char *)0x0) {
LAB_0010c132:
    bVar6 = false;
  }
  else {
    pcVar4 = buf + *len;
    local_4c = (int)(func_map->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    local_58 = (char *)CONCAT44(local_58._4_4_,4);
    bVar6 = false;
    local_40 = len;
    bVar1 = _SafeSprintf<MessageType>(this,false,buf,pcVar4,"%d|",(MessageType *)&local_58);
    if (bVar1) {
      pcVar5 = buf + 2;
      bVar6 = false;
      bVar1 = _SafeSprintf<int&>(this,false,pcVar5,pcVar4,"%d|",&local_4c);
      if (bVar1) {
        local_48 = buf;
        sVar2 = strlen(pcVar5);
        pcVar5 = pcVar5 + sVar2;
        p_Var3 = (func_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var7 = &(func_map->_M_t)._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var3 != p_Var7) {
          local_38 = &p_Var7->_M_header;
          do {
            local_58 = *(char **)(p_Var3 + 1);
            bVar1 = _SafeSprintf<char_const*>(this,false,pcVar5,pcVar4,"%s|",&local_58);
            if (!bVar1) goto LAB_0010c132;
            sVar2 = strlen(pcVar5);
            pcVar5 = pcVar5 + sVar2;
            local_58 = *(char **)(p_Var3 + 2);
            bVar1 = _SafeSprintf<char_const*>(this,false,pcVar5,pcVar4,"%s|",&local_58);
            if (!bVar1) goto LAB_0010c132;
            sVar2 = strlen(pcVar5);
            pcVar5 = pcVar5 + sVar2;
            p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
          } while (p_Var3 != local_38);
        }
        bVar6 = false;
        bVar1 = _SafeSprintf<char_const(&)[5]>
                          (this,false,pcVar5,pcVar4,"%s",(char (*) [5])"\r\n\r\n");
        pcVar4 = local_48;
        if (bVar1) {
          sVar2 = strlen(pcVar5);
          *local_40 = ((int)sVar2 + (int)pcVar5) - (int)pcVar4;
          bVar6 = true;
        }
      }
    }
  }
  return bVar6;
}

Assistant:

bool ParsePackage::PackageFuncList(char* buf, int& len, std::map<std::string, std::string>& func_map) {
    if (!buf) {
        return false;
    }

    char* end = buf + len;
    char* cur = buf;
    int num = (int)func_map.size();
    //type
    if (!_SafeSprintf(false, cur, end, "%d|", FUNCTION_INFO))
        return false;
    cur += 2;
    //function num
    if (!_SafeSprintf(false, cur, end, "%d|", num))
        return false;
    cur += strlen(cur);
    
    for (auto iter = func_map.begin(); iter != func_map.end(); ++iter) {
        if (!_SafeSprintf(false, cur, end, "%s|", iter->first.c_str()))
            return false;
        cur += strlen(cur);

        if (!_SafeSprintf(false, cur, end, "%s|", iter->second.c_str()))
            return false;
        cur += strlen(cur);
    }
    if (!_SafeSprintf(false, cur, end, "%s", "\r\n\r\n"))
        return false;
    cur += strlen(cur);
    len = cur - buf;
    return true;
}